

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O3

int freeDirHandle(DirHandle *dh,FileHandle *openList)

{
  while( true ) {
    if (openList == (FileHandle *)0x0) {
      (*dh->funcs->closeArchive)(dh->opaque);
      (*__PHYSFS_AllocatorHooks.Free)(dh->dirName);
      (*__PHYSFS_AllocatorHooks.Free)(dh->mountPoint);
      (*__PHYSFS_AllocatorHooks.Free)(dh);
      return 1;
    }
    if (openList->dirHandle == dh) break;
    openList = openList->next;
  }
  PHYSFS_setErrorCode(PHYSFS_ERR_FILES_STILL_OPEN);
  return 0;
}

Assistant:

static int freeDirHandle(DirHandle *dh, FileHandle *openList)
{
    FileHandle *i;

    if (dh == NULL)
        return 1;

    for (i = openList; i != NULL; i = i->next)
        BAIL_IF(i->dirHandle == dh, PHYSFS_ERR_FILES_STILL_OPEN, 0);

    dh->funcs->closeArchive(dh->opaque);
    allocator.Free(dh->dirName);
    allocator.Free(dh->mountPoint);
    allocator.Free(dh);
    return 1;
}